

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBCore.c
# Opt level: O2

void Bmc_ManBCoreCollect_rec(Gia_Man_t *p,int Id,int f,Vec_Int_t *vNodes,Vec_Int_t *vRootsNew)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  
  while( true ) {
    if (p->nTravIdsAlloc <= Id) {
      __assert_fail("Id < p->nTravIdsAlloc",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                    ,0x268,"int Gia_ObjIsTravIdCurrentId(Gia_Man_t *, int)");
    }
    if (p->pTravIds[Id] == p->nTravIds) {
      return;
    }
    p->pTravIds[Id] = p->nTravIds;
    pGVar4 = Gia_ManObj(p,Id);
    Bmc_ManBCoreAssignVar(p,pGVar4,f,vNodes);
    if (((~*(uint *)pGVar4 & 0x9fffffff) == 0) &&
       (iVar2 = Gia_ObjCioId(pGVar4), iVar2 < p->vCis->nSize - p->nRegs)) {
      return;
    }
    iVar2 = Gia_ObjIsRo(p,pGVar4);
    if (iVar2 != 0) {
      iVar2 = Gia_ObjIsRo(p,pGVar4);
      if (iVar2 == 0) {
        __assert_fail("Gia_ObjIsRo(p, pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1fd,"Gia_Obj_t *Gia_ObjRoToRi(Gia_Man_t *, Gia_Obj_t *)");
      }
      iVar2 = p->vCos->nSize;
      iVar1 = p->vCis->nSize;
      iVar3 = Gia_ObjCioId(pGVar4);
      pGVar4 = Gia_ManCo(p,(iVar2 - iVar1) + iVar3);
      iVar2 = Gia_ObjId(p,pGVar4);
      Vec_IntPush(vRootsNew,iVar2);
      return;
    }
    if (((int)(uint)*(undefined8 *)pGVar4 < 0) ||
       (((uint)*(undefined8 *)pGVar4 & 0x1fffffff) == 0x1fffffff)) break;
    iVar2 = Gia_ObjFaninId0p(p,pGVar4);
    Bmc_ManBCoreCollect_rec(p,iVar2,f,vNodes,vRootsNew);
    iVar2 = Gia_ObjId(p,pGVar4);
    Id = iVar2 - (*(uint *)&pGVar4->field_0x4 & 0x1fffffff);
  }
  __assert_fail("Gia_ObjIsAnd(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBCore.c"
                ,0x71,
                "void Bmc_ManBCoreCollect_rec(Gia_Man_t *, int, int, Vec_Int_t *, Vec_Int_t *)");
}

Assistant:

void Bmc_ManBCoreCollect_rec( Gia_Man_t * p, int Id, int f, Vec_Int_t * vNodes, Vec_Int_t * vRootsNew )
{
    Gia_Obj_t * pObj;
    if ( Gia_ObjIsTravIdCurrentId(p, Id) )
        return;
    Gia_ObjSetTravIdCurrentId(p, Id);
    pObj = Gia_ManObj( p, Id );
    Bmc_ManBCoreAssignVar( p, pObj, f, vNodes );
    if ( Gia_ObjIsPi(p, pObj) )
        return;
    if ( Gia_ObjIsRo(p, pObj) )
    {
        Vec_IntPush( vRootsNew, Gia_ObjId(p, Gia_ObjRoToRi(p, pObj)) );
        return;
    }
    assert( Gia_ObjIsAnd(pObj) );
    Bmc_ManBCoreCollect_rec( p, Gia_ObjFaninId0p(p, pObj), f, vNodes, vRootsNew );
    Bmc_ManBCoreCollect_rec( p, Gia_ObjFaninId1p(p, pObj), f, vNodes, vRootsNew );
}